

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cpp
# Opt level: O0

vector<FileStatus,_std::allocator<FileStatus>_> *
diffStatus(vector<FileStatus,_std::allocator<FileStatus>_> *__return_storage_ptr__,string *new_dir,
          string *old_dir)

{
  __type _Var1;
  char *pcVar2;
  iterator iVar3;
  iterator iVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  bool bVar8;
  string local_2d0 [32];
  undefined1 local_2b0 [8];
  FileStatus fileStatus_4;
  undefined1 local_268 [8];
  FileStatus fileStatus_3;
  undefined1 local_220 [8];
  FileStatus fileStatus_2;
  undefined1 local_1d8 [8];
  FileStatus fileStatus_1;
  undefined1 local_190 [8];
  FileStatus fileStatus;
  string local_148 [32];
  vector<DiffLine,_std::allocator<DiffLine>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [8];
  string file2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [8];
  string file1;
  int local_90;
  int local_8c;
  int j;
  int i;
  undefined1 local_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  old_files;
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  new_files;
  string *old_dir_local;
  string *new_dir_local;
  vector<FileStatus,_std::allocator<FileStatus>_> *result;
  
  new_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::vector<FileStatus,_std::allocator<FileStatus>_>::vector(__return_storage_ptr__);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  ls_abi_cxx11_((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_40,pcVar2);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  ls_abi_cxx11_((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_68,pcVar2);
  iVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_40);
  iVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_40);
  std::
  sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )iVar3._M_current,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )iVar4._M_current);
  iVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_68);
  iVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_68);
  std::
  sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )iVar3._M_current,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )iVar4._M_current);
  local_8c = 0;
  local_90 = 0;
  while( true ) {
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_40);
    bVar8 = false;
    if ((ulong)(long)local_8c < sVar5) {
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_68);
      bVar8 = (ulong)(long)local_90 < sVar5;
    }
    if (!bVar8) break;
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_40,(long)local_8c);
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_68,(long)local_90);
    _Var1 = std::operator==(pvVar7,pvVar6);
    if (_Var1) {
      std::operator+(local_d0,(char *)new_dir);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_40,(long)local_8c);
      std::operator+(local_b0,local_d0);
      std::__cxx11::string::~string((string *)local_d0);
      std::operator+(local_110,(char *)old_dir);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_68,(long)local_90);
      std::operator+(local_f0,local_110);
      std::__cxx11::string::~string((string *)local_110);
      std::__cxx11::string::string(local_148,(string *)local_b0);
      std::__cxx11::string::string((string *)&fileStatus.status,(string *)local_f0);
      diff_files(&local_128,(string *)local_148,(string *)&fileStatus.status);
      sVar5 = std::vector<DiffLine,_std::allocator<DiffLine>_>::size(&local_128);
      std::vector<DiffLine,_std::allocator<DiffLine>_>::~vector(&local_128);
      std::__cxx11::string::~string((string *)&fileStatus.status);
      std::__cxx11::string::~string(local_148);
      if (sVar5 != 0) {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_40,(long)local_8c);
        std::__cxx11::string::string((string *)&fileStatus_1.status,(string *)pvVar7);
        initFileStatus((FileStatus *)local_190,(string *)&fileStatus_1.status,modified);
        std::__cxx11::string::~string((string *)&fileStatus_1.status);
        std::vector<FileStatus,_std::allocator<FileStatus>_>::push_back
                  (__return_storage_ptr__,(value_type *)local_190);
        FileStatus::~FileStatus((FileStatus *)local_190);
      }
      local_8c = local_8c + 1;
      local_90 = local_90 + 1;
      std::__cxx11::string::~string((string *)local_f0);
      std::__cxx11::string::~string((string *)local_b0);
    }
    else {
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_40,(long)local_8c);
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_68,(long)local_90);
      bVar8 = std::operator>(pvVar7,pvVar6);
      if (bVar8) {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_68,(long)local_90);
        std::__cxx11::string::string((string *)&fileStatus_2.status,(string *)pvVar7);
        initFileStatus((FileStatus *)local_1d8,(string *)&fileStatus_2.status,removed);
        std::__cxx11::string::~string((string *)&fileStatus_2.status);
        std::vector<FileStatus,_std::allocator<FileStatus>_>::push_back
                  (__return_storage_ptr__,(value_type *)local_1d8);
        local_90 = local_90 + 1;
        FileStatus::~FileStatus((FileStatus *)local_1d8);
      }
      else {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_40,(long)local_8c);
        std::__cxx11::string::string((string *)&fileStatus_3.status,(string *)pvVar7);
        initFileStatus((FileStatus *)local_220,(string *)&fileStatus_3.status,added);
        std::__cxx11::string::~string((string *)&fileStatus_3.status);
        std::vector<FileStatus,_std::allocator<FileStatus>_>::push_back
                  (__return_storage_ptr__,(value_type *)local_220);
        local_8c = local_8c + 1;
        FileStatus::~FileStatus((FileStatus *)local_220);
      }
    }
  }
  while (sVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_40), (ulong)(long)local_8c < sVar5) {
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_40,(long)local_8c);
    std::__cxx11::string::string((string *)&fileStatus_4.status,(string *)pvVar7);
    initFileStatus((FileStatus *)local_268,(string *)&fileStatus_4.status,added);
    std::__cxx11::string::~string((string *)&fileStatus_4.status);
    std::vector<FileStatus,_std::allocator<FileStatus>_>::push_back
              (__return_storage_ptr__,(value_type *)local_268);
    local_8c = local_8c + 1;
    FileStatus::~FileStatus((FileStatus *)local_268);
  }
  while (sVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_68), (ulong)(long)local_90 < sVar5) {
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_68,(long)local_90);
    std::__cxx11::string::string(local_2d0,(string *)pvVar7);
    initFileStatus((FileStatus *)local_2b0,(string *)local_2d0,removed);
    std::__cxx11::string::~string(local_2d0);
    std::vector<FileStatus,_std::allocator<FileStatus>_>::push_back
              (__return_storage_ptr__,(value_type *)local_2b0);
    local_90 = local_90 + 1;
    FileStatus::~FileStatus((FileStatus *)local_2b0);
  }
  new_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40);
  if ((new_files.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    std::vector<FileStatus,_std::allocator<FileStatus>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<FileStatus> diffStatus(String new_dir,String old_dir){
    Vector<FileStatus> result;
    Vector<String> new_files = ls(new_dir.c_str());
    Vector<String> old_files = ls(old_dir.c_str());
    sort(new_files.begin(),new_files.end());
    sort(old_files.begin(),old_files.end());
    int i = 0;
    int j = 0;
    while(i < new_files.size() && j < old_files.size()){
        if(new_files[i] == old_files[j]){
            String file1 = new_dir + "/" + new_files[i];
            String file2 = old_dir + "/" + old_files[j];
            if(diff_files(file1,file2).size()>0){
                FileStatus fileStatus = initFileStatus(new_files[i],modified);
                result.push_back(fileStatus);
            }
            i++;
            j++;
        }
        else{
            if(new_files[i] > old_files[j]){
                FileStatus fileStatus = initFileStatus(old_files[j],removed);
                result.push_back(fileStatus);
                j++;
            }
            else{
                FileStatus fileStatus = initFileStatus(new_files[i],added);
                result.push_back(fileStatus);
                i++;
            }
        }
    }
    while(i < new_files.size()){
        FileStatus fileStatus = initFileStatus(new_files[i],added);
        result.push_back(fileStatus);
        i++;
    }
    while(j < old_files.size()){
        FileStatus fileStatus = initFileStatus(old_files[j],removed);
        result.push_back(fileStatus);
        j++;
    }
    return result;
}